

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

hash_t __thiscall duckdb::ArrowExtensionMetadata::GetHash(ArrowExtensionMetadata *this)

{
  hash_t hVar1;
  hash_t hVar2;
  hash_t hVar3;
  
  hVar1 = Hash<char_const*>((this->extension_name)._M_dataplus._M_p);
  hVar2 = Hash<char_const*>((this->vendor_name)._M_dataplus._M_p);
  hVar3 = Hash<char_const*>((this->type_name)._M_dataplus._M_p);
  return hVar3 ^ hVar2 ^ hVar1;
}

Assistant:

hash_t ArrowExtensionMetadata::GetHash() const {
	const auto h_extension = Hash(extension_name.c_str());
	const auto h_vendor = Hash(vendor_name.c_str());
	const auto h_type = Hash(type_name.c_str());
	// Most arrow extensions are unique on the extension name
	// However we use arrow.opaque as all the non-canonical extensions, hence we do a hash-aroo of all.
	return CombineHash(h_extension, CombineHash(h_vendor, h_type));
}